

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_48f05::CleanTestCleanDyndepMissing::Run(CleanTestCleanDyndepMissing *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  TimeStamp TVar4;
  string err;
  Cleaner cleaner;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  Cleaner local_c0;
  
  iVar3 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,"build out: cat in || dd\n  dyndep = dd\n",(ManifestParserOptions)0x0);
  if (iVar3 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"in",(allocator<char> *)&local_e0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"out",(allocator<char> *)&local_e0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
    VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"out.imp",(allocator<char> *)&local_e0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
    VirtualFileSystem::Create(this_00,(string *)&local_c0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    Cleaner::Cleaner(&local_c0,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface)
    ;
    bVar2 = testing::Test::Check
                      (g_current_test,local_c0.cleaned_files_count_ == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,0x152,"0 == cleaner.cleaned_files_count()");
    pTVar1 = g_current_test;
    if (bVar2) {
      iVar3 = Cleaner::CleanAll(&local_c0,false);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                 ,0x153,"0 == cleaner.CleanAll()");
      testing::Test::Check
                (g_current_test,local_c0.cleaned_files_count_ == 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                 ,0x154,"1 == cleaner.cleaned_files_count()");
      testing::Test::Check
                (g_current_test,
                 (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
                 _M_node_count == 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                 ,0x155,"1u == fs_.files_removed_.size()");
      pTVar1 = g_current_test;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"out",&local_101);
      TVar4 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
      testing::Test::Check
                (pTVar1,TVar4 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                 ,0x158,"0 == fs_.Stat(\"out\", &err)");
      std::__cxx11::string::~string((string *)&local_e0);
      pTVar1 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"out.imp",&local_101);
      TVar4 = VirtualFileSystem::Stat(this_00,&local_e0,&local_100);
      testing::Test::Check
                (pTVar1,TVar4 == 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                 ,0x159,"1 == fs_.Stat(\"out.imp\", &err)");
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    Cleaner::~Cleaner(&local_c0);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanDyndepMissing) {
  // Verify that a missing dyndep file is tolerated.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat in || dd\n"
"  dyndep = dd\n"
  ));
  fs_.Create("in", "");
  fs_.Create("out", "");
  fs_.Create("out.imp", "");

  Cleaner cleaner(&state_, config_, &fs_);

  ASSERT_EQ(0, cleaner.cleaned_files_count());
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(1, cleaner.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());

  string err;
  EXPECT_EQ(0, fs_.Stat("out", &err));
  EXPECT_EQ(1, fs_.Stat("out.imp", &err));
}